

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O1

void ensure_dsa(void)

{
  if (dsap == (BIGNUM *)0x0) {
    dsap = (BIGNUM *)BN_new();
    BN_bin2bn(dsap_,0x80,(BIGNUM *)dsap);
  }
  if (dsaq == (BIGNUM *)0x0) {
    dsaq = (BIGNUM *)BN_new();
    BN_bin2bn(dsaq_,0x14,(BIGNUM *)dsaq);
  }
  if (dsap == (BIGNUM *)0x0) {
    dsap = (BIGNUM *)BN_new();
    BN_bin2bn(dsap_,0x80,(BIGNUM *)dsap);
  }
  if (dsag != (BIGNUM *)0x0) {
    return;
  }
  dsag = (BIGNUM *)BN_new();
  BN_bin2bn(dsag_,0x80,(BIGNUM *)dsag);
  return;
}

Assistant:

void ensure_dsa(void)
{
  if(!dsap)
  {
    dsap = BN_new();
    BN_bin2bn(dsap_, 128, dsap);
  }
  if(!dsaq)
  {
    dsaq = BN_new();
    BN_bin2bn(dsaq_, 20, dsaq);
  }
  if(!dsap)
  {
    dsap = BN_new();
    BN_bin2bn(dsap_, 128, dsap);
  }
  if(!dsag)
  {
    dsag = BN_new();
    BN_bin2bn(dsag_, 128, dsag);
  }
}